

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCreator_AM.h
# Opt level: O2

string * __thiscall
BGIP_SolverCreator_AM<JointPolicyPureVectorForClusteredBG>::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,
          BGIP_SolverCreator_AM<JointPolicyPureVectorForClusteredBG> *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"BGIP_SolverCreator_AM object with ");
  poVar1 = std::operator<<(poVar1,", _m_verbose=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->_m_verbose);
  poVar1 = std::operator<<(poVar1,", _m_nrSolutions=");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", _m_nrRestarts=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string SoftPrint() const
        {
            std::stringstream ss;
            ss << "BGIP_SolverCreator_AM object with "<<
                ", _m_verbose="<<_m_verbose <<
                ", _m_nrSolutions="<<_m_nrSolutions<<
                ", _m_nrRestarts="<<_m_nrRestarts;
            return (ss.str());
        }